

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclPrintFaninPairs(SC_Man *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  SC_Man *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_2c);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
      for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_30 < iVar1; local_30 = local_30 + 1
          ) {
        pObj_01 = Abc_ObjFanin(pObj_00,local_30);
        iVar1 = Abc_ObjIsNode(pObj_01);
        if ((iVar1 != 0) && (iVar1 = Abc_ObjFanoutNum(pObj_01), iVar1 == 1)) {
          Abc_SclCheckCommonInputs(pObj_00,pObj_01);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_SclPrintFaninPairs( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
                Abc_SclCheckCommonInputs( pObj, pFanin );
}